

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

df_solver_t * __thiscall
tchecker::clockbounds::df_solver_t::operator=(df_solver_t *this,df_solver_t *solver)

{
  size_t __n;
  db_t *pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (this != solver) {
    this->_loc_number = solver->_loc_number;
    this->_clock_number = solver->_clock_number;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->_loc_pid,&solver->_loc_pid);
    this->_dim = solver->_dim;
    if (this->_L != (db_t *)0x0) {
      operator_delete__(this->_L);
    }
    uVar2 = this->_dim * this->_dim;
    uVar3 = uVar2 * 4;
    pdVar1 = (db_t *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar3);
    this->_L = pdVar1;
    memcpy(pdVar1,solver->_L,uVar3);
    if (this->_U != (db_t *)0x0) {
      operator_delete__(this->_U);
    }
    uVar3 = this->_dim * this->_dim;
    __n = uVar3 * 4;
    uVar2 = 0xffffffffffffffff;
    if (uVar3 < 0x4000000000000000) {
      uVar2 = __n;
    }
    pdVar1 = (db_t *)operator_new__(uVar2);
    this->_U = pdVar1;
    memcpy(pdVar1,solver->_U,__n);
    this->_updated_L = solver->_updated_L;
    this->_updated_U = solver->_updated_U;
  }
  return this;
}

Assistant:

tchecker::clockbounds::df_solver_t & df_solver_t::operator=(tchecker::clockbounds::df_solver_t const & solver)
{
  if (this != &solver) {
    _loc_number = solver._loc_number;
    _clock_number = solver._clock_number;
    _loc_pid = solver._loc_pid;
    _dim = solver._dim;

    delete[] _L;
    _L = new tchecker::dbm::db_t[_dim * _dim];
    memcpy(_L, solver._L, _dim * _dim * sizeof(*_L));

    delete[] _U;
    _U = new tchecker::dbm::db_t[_dim * _dim];
    memcpy(_U, solver._U, _dim * _dim * sizeof(*_U));

    _updated_L = solver._updated_L;
    _updated_U = solver._updated_U;
  }

  return *this;
}